

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::IsAttributeSet
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,uint32 index,PropertyAttributes attr)

{
  bool bVar1;
  byte bVar2;
  int local_28;
  uint32 local_24;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  local_24 = index;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_24,
                     (IndexPropertyDescriptor **)&i,&local_28);
  if (bVar1) {
    bVar2 = 1;
    if ((_i->Attributes & 8) == 0) {
      bVar2 = attr & _i->Attributes;
    }
  }
  else {
    bVar2 = attr & this->dataItemAttributes;
  }
  return (BOOL)bVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsAttributeSet(uint32 index, PropertyAttributes attr)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (!(descriptor->Attributes & PropertyDeleted))
            {
                return descriptor->Attributes & attr;
            }
        }
        else
        {
            return GetDataItemAttributes() & attr;
        }

        return true;
    }